

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangulated_Surface.h
# Opt level: O2

void __thiscall
Nova::Triangulated_Surface<float>::Write_OBJ(Triangulated_Surface<float> *this,string *filename)

{
  Array<Nova::Vector<int,_3,_true>_> *this_00;
  ostream *poVar1;
  ostream *poVar2;
  Vector<float,_3,_true> *pVVar3;
  Vector<int,_3,_true> *pVVar4;
  int iVar5;
  size_t i_1;
  size_t i;
  ulong uVar6;
  
  poVar1 = (ostream *)Nova::File_Utilities::Safe_Open_Output((string *)filename,false);
  if (poVar1 != (ostream *)0x0) {
    for (uVar6 = 0;
        uVar6 < (ulong)(((long)(this->super_Point_Cloud<float,_3>).points._data.
                               super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->super_Point_Cloud<float,_3>).points._data.
                              super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0xc); uVar6 = uVar6 + 1)
    {
      poVar2 = std::operator<<(poVar1,"v ");
      iVar5 = (int)uVar6;
      pVVar3 = Array<Nova::Vector<float,_3,_true>_>::operator[]
                         ((Array<Nova::Vector<float,_3,_true>_> *)this,iVar5);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pVVar3->_data)._M_elems[0]);
      poVar2 = std::operator<<(poVar2," ");
      pVVar3 = Array<Nova::Vector<float,_3,_true>_>::operator[]
                         ((Array<Nova::Vector<float,_3,_true>_> *)this,iVar5);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pVVar3->_data)._M_elems[1]);
      poVar2 = std::operator<<(poVar2," ");
      pVVar3 = Array<Nova::Vector<float,_3,_true>_>::operator[]
                         ((Array<Nova::Vector<float,_3,_true>_> *)this,iVar5);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pVVar3->_data)._M_elems[2]);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    this_00 = &(this->super_Simplex_Mesh<3>).elements;
    uVar6 = 0;
    while( true ) {
      if ((ulong)(((long)(this->super_Simplex_Mesh<3>).elements._data.
                         super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->super_Simplex_Mesh<3>).elements._data.
                        super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0xc) <= uVar6) break;
      poVar2 = std::operator<<(poVar1,"f ");
      iVar5 = (int)uVar6;
      pVVar4 = Array<Nova::Vector<int,_3,_true>_>::operator[](this_00,iVar5);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pVVar4->_data)._M_elems[0] + 1);
      poVar2 = std::operator<<(poVar2," ");
      pVVar4 = Array<Nova::Vector<int,_3,_true>_>::operator[](this_00,iVar5);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pVVar4->_data)._M_elems[1] + 1);
      poVar2 = std::operator<<(poVar2," ");
      pVVar4 = Array<Nova::Vector<int,_3,_true>_>::operator[](this_00,iVar5);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(pVVar4->_data)._M_elems[2] + 1);
      std::endl<char,std::char_traits<char>>(poVar2);
      uVar6 = uVar6 + 1;
    }
    (**(code **)(*(long *)poVar1 + 8))(poVar1);
    return;
  }
  return;
}

Assistant:

void Write_OBJ(const std::string& filename)
    {
        std::ostream *output=File_Utilities::Safe_Open_Output(filename,false);
        if(output!=nullptr)
        {
            for(size_t i=0;i<points.size();++i) *output<<"v "<<points[i][0]<<" "<<points[i][1]<<" "<<points[i][2]<<std::endl;
            for(size_t i=0;i<elements.size();++i) *output<<"f "<<elements[i][0]+1<<" "<<elements[i][1]+1<<" "<<elements[i][2]+1<<std::endl;
        }
        delete output;
    }